

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getFirstLeakForAllocationStage
          (MemoryLeakDetectorTable *this,uchar allocation_stage)

{
  MemoryLeakDetectorNode *pMVar1;
  undefined8 in_RDI;
  MemoryLeakDetectorNode *node;
  int i;
  MemoryLeakDetectorList *in_stack_ffffffffffffffe0;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    if (0x48 < local_18) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    pMVar1 = MemoryLeakDetectorList::getFirstLeakForAllocationStage
                       (in_stack_ffffffffffffffe0,(uchar)((ulong)in_RDI >> 0x38));
    if (pMVar1 != (MemoryLeakDetectorNode *)0x0) break;
    local_18 = local_18 + 1;
    in_stack_ffffffffffffffe0 = (MemoryLeakDetectorList *)0x0;
  }
  return pMVar1;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getFirstLeakForAllocationStage(unsigned char allocation_stage)
{
    for (int i = 0; i < hash_prime; i++) {
        MemoryLeakDetectorNode* node = table_[i].getFirstLeakForAllocationStage(allocation_stage);
        if (node) return node;
    }
    return NULLPTR;
}